

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadListOp<long>(CrateReader *this,ListOp<long> *d)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_258 [8];
  vector<long,_std::allocator<long>_> items_5;
  vector<long,_std::allocator<long>_> items_4;
  vector<long,_std::allocator<long>_> items_3;
  vector<long,_std::allocator<long>_> items_2;
  vector<long,_std::allocator<long>_> items_1;
  undefined1 local_1d8 [8];
  vector<long,_std::allocator<long>_> items;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  ListOpHeader local_21;
  ListOp<long> *pLStack_20;
  ListOpHeader h;
  ListOp<long> *d_local;
  CrateReader *this_local;
  
  pLStack_20 = d;
  ListOpHeader::ListOpHeader(&local_21);
  bVar1 = StreamReader::read1(this->_sr,&local_21.bits);
  if (bVar1) {
    bVar1 = ListOpHeader::IsExplicit(&local_21);
    if (bVar1) {
      ListOp<long>::ClearAndMakeExplicit(pLStack_20);
    }
    bVar1 = ListOpHeader::HasExplicitItems(&local_21);
    if (bVar1) {
      ::std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)local_1d8);
      bVar1 = ReadArray<long>(this,(vector<long,_std::allocator<long>_> *)local_1d8);
      if (bVar1) {
        ListOp<long>::SetExplicitItems(pLStack_20,(vector<long,_std::allocator<long>_> *)local_1d8);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::ExplicitItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)local_1d8);
      if (!bVar1) goto LAB_00257621;
    }
    bVar1 = ListOpHeader::HasAddedItems(&local_21);
    if (bVar1) {
      ::std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)
                 &items_2.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      bVar1 = ReadArray<long>(this,(vector<long,_std::allocator<long>_> *)
                                   &items_2.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        ListOp<long>::SetAddedItems
                  (pLStack_20,
                   (vector<long,_std::allocator<long>_> *)
                   &items_2.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::AddedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)
                 &items_2.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) goto LAB_00257621;
    }
    bVar1 = ListOpHeader::HasPrependedItems(&local_21);
    if (bVar1) {
      ::std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)
                 &items_3.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      bVar1 = ReadArray<long>(this,(vector<long,_std::allocator<long>_> *)
                                   &items_3.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        ListOp<long>::SetPrependedItems
                  (pLStack_20,
                   (vector<long,_std::allocator<long>_> *)
                   &items_3.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::PrependedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)
                 &items_3.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) goto LAB_00257621;
    }
    bVar1 = ListOpHeader::HasAppendedItems(&local_21);
    if (bVar1) {
      ::std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)
                 &items_4.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      bVar1 = ReadArray<long>(this,(vector<long,_std::allocator<long>_> *)
                                   &items_4.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        ListOp<long>::SetAppendedItems
                  (pLStack_20,
                   (vector<long,_std::allocator<long>_> *)
                   &items_4.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::AppendedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)
                 &items_4.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) goto LAB_00257621;
    }
    bVar1 = ListOpHeader::HasDeletedItems(&local_21);
    if (bVar1) {
      ::std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)
                 &items_5.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      bVar1 = ReadArray<long>(this,(vector<long,_std::allocator<long>_> *)
                                   &items_5.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        ListOp<long>::SetDeletedItems
                  (pLStack_20,
                   (vector<long,_std::allocator<long>_> *)
                   &items_5.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::DeletedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)
                 &items_5.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) goto LAB_00257621;
    }
    bVar1 = ListOpHeader::HasOrderedItems(&local_21);
    if (bVar1) {
      ::std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)local_258);
      bVar1 = ReadArray<long>(this,(vector<long,_std::allocator<long>_> *)local_258);
      if (bVar1) {
        ListOp<long>::SetOrderedItems(pLStack_20,(vector<long,_std::allocator<long>_> *)local_258);
      }
      else {
        ::std::__cxx11::string::operator+=
                  ((string *)&this->_err,"Failed to read ListOp::OrderedItems.\n");
        this_local._7_1_ = 0;
      }
      ::std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)local_258);
      if (!bVar1) goto LAB_00257621;
    }
    this_local._7_1_ = 1;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadListOp");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x660);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a0,"Failed to read ListOpHeader.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)
                   &items.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string
              ((string *)
               &items.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    this_local._7_1_ = 0;
  }
LAB_00257621:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadListOp(ListOp<T> *d) {
  // read ListOpHeader
  ListOpHeader h;
  if (!_sr->read1(&h.bits)) {
    PUSH_ERROR("Failed to read ListOpHeader.");
    return false;
  }

  if (h.IsExplicit()) {
    d->ClearAndMakeExplicit();
  }

  //
  // NOTE: array data is not compressed even for Int type
  //

  if (h.HasExplicitItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::ExplicitItems.\n";
      return false;
    }

    d->SetExplicitItems(items);
  }

  if (h.HasAddedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::AddedItems.\n";
      return false;
    }

    d->SetAddedItems(items);
  }

  if (h.HasPrependedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::PrependedItems.\n";
      return false;
    }

    d->SetPrependedItems(items);
  }

  if (h.HasAppendedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::AppendedItems.\n";
      return false;
    }

    d->SetAppendedItems(items);
  }

  if (h.HasDeletedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::DeletedItems.\n";
      return false;
    }

    d->SetDeletedItems(items);
  }

  if (h.HasOrderedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::OrderedItems.\n";
      return false;
    }

    d->SetOrderedItems(items);
  }

  return true;
}